

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 (*pauVar7) [16];
  int iVar8;
  undefined4 uVar9;
  undefined1 (*pauVar10) [16];
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [32];
  undefined1 auVar38 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  float fVar84;
  float fVar88;
  float fVar89;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar97;
  float fVar98;
  undefined1 auVar96 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13a9;
  ulong local_13a8;
  undefined8 local_13a0;
  float fStack_1398;
  float fStack_1394;
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  Scene *local_1340;
  undefined8 uStack_1338;
  undefined1 local_1330 [16];
  size_t local_1318;
  RayHitK<8> *local_1310;
  long local_1308;
  ulong local_1300;
  ulong local_12f8;
  RTCFilterFunctionNArguments local_12f0;
  undefined1 local_12c0 [16];
  float local_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  undefined1 local_12a0 [16];
  undefined1 local_1290 [16];
  undefined1 *local_1280;
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [32];
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float local_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float local_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float local_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [16];
  undefined1 auStack_10b0 [16];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar52 [32];
  
  pauVar10 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar9 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1160._4_4_ = uVar9;
  local_1160._0_4_ = uVar9;
  local_1160._8_4_ = uVar9;
  local_1160._12_4_ = uVar9;
  auVar80 = ZEXT1664(local_1160);
  uVar9 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1170._4_4_ = uVar9;
  local_1170._0_4_ = uVar9;
  local_1170._8_4_ = uVar9;
  local_1170._12_4_ = uVar9;
  auVar81 = ZEXT1664(local_1170);
  uVar9 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1180._4_4_ = uVar9;
  local_1180._0_4_ = uVar9;
  local_1180._8_4_ = uVar9;
  local_1180._12_4_ = uVar9;
  auVar83 = ZEXT1664(local_1180);
  fVar99 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar107 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar111 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar90 = fVar99 * 0.99999964;
  fVar94 = fVar107 * 0.99999964;
  fVar95 = fVar111 * 0.99999964;
  fVar99 = fVar99 * 1.0000004;
  fVar107 = fVar107 * 1.0000004;
  fVar111 = fVar111 * 1.0000004;
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_12f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1300 = uVar17 ^ 0x10;
  uVar21 = local_12f8 ^ 0x10;
  iVar8 = (tray->tnear).field_0.i[k];
  local_12c0._4_4_ = iVar8;
  local_12c0._0_4_ = iVar8;
  local_12c0._8_4_ = iVar8;
  local_12c0._12_4_ = iVar8;
  auVar75 = ZEXT1664(local_12c0);
  iVar8 = (tray->tfar).field_0.i[k];
  auVar29 = ZEXT1664(CONCAT412(iVar8,CONCAT48(iVar8,CONCAT44(iVar8,iVar8))));
  iVar8 = 1 << ((uint)k & 0x1f);
  auVar39._4_4_ = iVar8;
  auVar39._0_4_ = iVar8;
  auVar39._8_4_ = iVar8;
  auVar39._12_4_ = iVar8;
  auVar39._16_4_ = iVar8;
  auVar39._20_4_ = iVar8;
  auVar39._24_4_ = iVar8;
  auVar39._28_4_ = iVar8;
  auVar52 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar39 = vpand_avx2(auVar39,auVar52);
  local_10e0 = vpcmpeqd_avx2(auVar39,auVar52);
  local_1190 = fVar90;
  fStack_118c = fVar90;
  fStack_1188 = fVar90;
  fStack_1184 = fVar90;
  local_11a0 = fVar94;
  fStack_119c = fVar94;
  fStack_1198 = fVar94;
  fStack_1194 = fVar94;
  local_11b0 = fVar95;
  fStack_11ac = fVar95;
  fStack_11a8 = fVar95;
  fStack_11a4 = fVar95;
  local_11c0 = fVar99;
  fStack_11bc = fVar99;
  fStack_11b8 = fVar99;
  fStack_11b4 = fVar99;
  local_11d0 = fVar107;
  fStack_11cc = fVar107;
  fStack_11c8 = fVar107;
  fStack_11c4 = fVar107;
  local_11e0 = fVar111;
  fStack_11dc = fVar111;
  fStack_11d8 = fVar111;
  fStack_11d4 = fVar111;
  local_1310 = ray;
  local_1318 = k;
  local_13a8 = uVar17;
  fVar110 = fVar111;
  fVar109 = fVar111;
  fVar108 = fVar111;
  fVar105 = fVar107;
  fVar103 = fVar107;
  fVar101 = fVar107;
  fVar98 = fVar99;
  fVar97 = fVar99;
  fVar106 = fVar99;
  fVar104 = fVar95;
  fVar102 = fVar95;
  fVar100 = fVar95;
  fVar93 = fVar94;
  fVar92 = fVar94;
  fVar91 = fVar94;
  fVar89 = fVar90;
  fVar88 = fVar90;
  fVar84 = fVar90;
LAB_0055fa3b:
  do {
    pauVar7 = pauVar10 + -1;
    pauVar10 = pauVar10 + -1;
    if (*(float *)(*pauVar7 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar14 = *(ulong *)*pauVar10;
      while ((uVar14 & 8) == 0) {
        auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar17),auVar80._0_16_);
        auVar30._0_4_ = fVar84 * auVar31._0_4_;
        auVar30._4_4_ = fVar88 * auVar31._4_4_;
        auVar30._8_4_ = fVar89 * auVar31._8_4_;
        auVar30._12_4_ = fVar90 * auVar31._12_4_;
        auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + local_12f8),auVar81._0_16_);
        auVar41._0_4_ = fVar91 * auVar31._0_4_;
        auVar41._4_4_ = fVar92 * auVar31._4_4_;
        auVar41._8_4_ = fVar93 * auVar31._8_4_;
        auVar41._12_4_ = fVar94 * auVar31._12_4_;
        auVar31 = vmaxps_avx(auVar30,auVar41);
        auVar30 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar20),auVar83._0_16_);
        auVar42._0_4_ = fVar100 * auVar30._0_4_;
        auVar42._4_4_ = fVar102 * auVar30._4_4_;
        auVar42._8_4_ = fVar104 * auVar30._8_4_;
        auVar42._12_4_ = fVar95 * auVar30._12_4_;
        auVar30 = vmaxps_avx(auVar42,auVar75._0_16_);
        auVar30 = vmaxps_avx(auVar31,auVar30);
        auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + local_1300),auVar80._0_16_);
        auVar43._0_4_ = fVar106 * auVar31._0_4_;
        auVar43._4_4_ = fVar97 * auVar31._4_4_;
        auVar43._8_4_ = fVar98 * auVar31._8_4_;
        auVar43._12_4_ = fVar99 * auVar31._12_4_;
        auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + uVar21),auVar81._0_16_);
        auVar53._0_4_ = fVar101 * auVar31._0_4_;
        auVar53._4_4_ = fVar103 * auVar31._4_4_;
        auVar53._8_4_ = fVar105 * auVar31._8_4_;
        auVar53._12_4_ = fVar107 * auVar31._12_4_;
        auVar31 = vminps_avx(auVar43,auVar53);
        auVar41 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + (uVar20 ^ 0x10)),auVar83._0_16_)
        ;
        auVar54._0_4_ = fVar108 * auVar41._0_4_;
        auVar54._4_4_ = fVar109 * auVar41._4_4_;
        auVar54._8_4_ = fVar110 * auVar41._8_4_;
        auVar54._12_4_ = fVar111 * auVar41._12_4_;
        auVar41 = vminps_avx(auVar54,auVar29._0_16_);
        auVar31 = vminps_avx(auVar31,auVar41);
        auVar31 = vcmpps_avx(auVar30,auVar31,2);
        uVar11 = vmovmskps_avx(auVar31);
        local_10c0 = (RTCHitN  [16])auVar30;
        if (uVar11 == 0) {
          if (pauVar10 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_0055fa3b;
        }
        uVar11 = uVar11 & 0xff;
        uVar18 = uVar14 & 0xfffffffffffffff0;
        lVar19 = 0;
        for (uVar14 = (ulong)uVar11; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
          lVar19 = lVar19 + 1;
        }
        uVar14 = *(ulong *)(uVar18 + lVar19 * 8);
        uVar11 = uVar11 - 1 & uVar11;
        uVar12 = (ulong)uVar11;
        if (uVar11 != 0) {
          uVar2 = *(uint *)(local_10c0 + lVar19 * 4);
          lVar19 = 0;
          for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
            lVar19 = lVar19 + 1;
          }
          uVar11 = uVar11 - 1 & uVar11;
          uVar15 = (ulong)uVar11;
          uVar12 = *(ulong *)(uVar18 + lVar19 * 8);
          uVar3 = *(uint *)(local_10c0 + lVar19 * 4);
          uVar17 = local_13a8;
          if (uVar11 == 0) {
            if (uVar2 < uVar3) {
              *(ulong *)*pauVar10 = uVar12;
              *(uint *)(*pauVar10 + 8) = uVar3;
              pauVar10 = pauVar10 + 1;
            }
            else {
              *(ulong *)*pauVar10 = uVar14;
              *(uint *)(*pauVar10 + 8) = uVar2;
              pauVar10 = pauVar10 + 1;
              uVar14 = uVar12;
            }
          }
          else {
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar14;
            auVar31 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar2));
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar12;
            auVar30 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar3));
            lVar19 = 0;
            for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar19 = lVar19 + 1;
            }
            uVar11 = uVar11 - 1 & uVar11;
            uVar14 = (ulong)uVar11;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = *(ulong *)(uVar18 + lVar19 * 8);
            auVar42 = vpunpcklqdq_avx(auVar55,ZEXT416(*(uint *)(local_10c0 + lVar19 * 4)));
            auVar41 = vpcmpgtd_avx(auVar30,auVar31);
            if (uVar11 == 0) {
              auVar43 = vpshufd_avx(auVar41,0xaa);
              auVar41 = vblendvps_avx(auVar30,auVar31,auVar43);
              auVar31 = vblendvps_avx(auVar31,auVar30,auVar43);
              auVar30 = vpcmpgtd_avx(auVar42,auVar41);
              auVar43 = vpshufd_avx(auVar30,0xaa);
              auVar30 = vblendvps_avx(auVar42,auVar41,auVar43);
              auVar41 = vblendvps_avx(auVar41,auVar42,auVar43);
              auVar42 = vpcmpgtd_avx(auVar41,auVar31);
              auVar43 = vpshufd_avx(auVar42,0xaa);
              auVar42 = vblendvps_avx(auVar41,auVar31,auVar43);
              auVar31 = vblendvps_avx(auVar31,auVar41,auVar43);
              *pauVar10 = auVar31;
              pauVar10[1] = auVar42;
              uVar14 = auVar30._0_8_;
              pauVar10 = pauVar10 + 2;
            }
            else {
              lVar19 = 0;
              for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                lVar19 = lVar19 + 1;
              }
              auVar65._8_8_ = 0;
              auVar65._0_8_ = *(ulong *)(uVar18 + lVar19 * 8);
              auVar53 = vpunpcklqdq_avx(auVar65,ZEXT416(*(uint *)(local_10c0 + lVar19 * 4)));
              auVar43 = vpshufd_avx(auVar41,0xaa);
              auVar41 = vblendvps_avx(auVar30,auVar31,auVar43);
              auVar31 = vblendvps_avx(auVar31,auVar30,auVar43);
              auVar30 = vpcmpgtd_avx(auVar53,auVar42);
              auVar43 = vpshufd_avx(auVar30,0xaa);
              auVar30 = vblendvps_avx(auVar53,auVar42,auVar43);
              auVar42 = vblendvps_avx(auVar42,auVar53,auVar43);
              auVar43 = vpcmpgtd_avx(auVar42,auVar31);
              auVar53 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar42,auVar31,auVar53);
              auVar31 = vblendvps_avx(auVar31,auVar42,auVar53);
              auVar42 = vpcmpgtd_avx(auVar30,auVar41);
              auVar53 = vpshufd_avx(auVar42,0xaa);
              auVar42 = vblendvps_avx(auVar30,auVar41,auVar53);
              auVar30 = vblendvps_avx(auVar41,auVar30,auVar53);
              auVar41 = vpcmpgtd_avx(auVar43,auVar30);
              auVar53 = vpshufd_avx(auVar41,0xaa);
              auVar41 = vblendvps_avx(auVar43,auVar30,auVar53);
              auVar30 = vblendvps_avx(auVar30,auVar43,auVar53);
              *pauVar10 = auVar31;
              pauVar10[1] = auVar30;
              pauVar10[2] = auVar41;
              auVar75 = ZEXT1664(local_12c0);
              uVar14 = auVar42._0_8_;
              pauVar10 = pauVar10 + 3;
            }
          }
        }
      }
      local_1308 = (ulong)((uint)uVar14 & 0xf) - 8;
      if (local_1308 != 0) {
        uVar14 = uVar14 & 0xfffffffffffffff0;
        lVar19 = 0;
        do {
          local_1280 = &local_13a9;
          lVar13 = lVar19 * 0xb0;
          uVar9 = *(undefined4 *)(ray + k * 4);
          auVar22._4_4_ = uVar9;
          auVar22._0_4_ = uVar9;
          auVar22._8_4_ = uVar9;
          auVar22._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar45._4_4_ = uVar9;
          auVar45._0_4_ = uVar9;
          auVar45._8_4_ = uVar9;
          auVar45._12_4_ = uVar9;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar56._4_4_ = uVar9;
          auVar56._0_4_ = uVar9;
          auVar56._8_4_ = uVar9;
          auVar56._12_4_ = uVar9;
          local_1350 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + lVar13),auVar22);
          local_1360 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x10 + lVar13),auVar45);
          auVar31 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x20 + lVar13),auVar56);
          auVar30 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x30 + lVar13),auVar22);
          auVar41 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x40 + lVar13),auVar45);
          auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x50 + lVar13),auVar56);
          auVar43 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x60 + lVar13),auVar22);
          auVar53 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x70 + lVar13),auVar45);
          auVar54 = vsubps_avx(*(undefined1 (*) [16])(uVar14 + 0x80 + lVar13),auVar56);
          auVar44 = vsubps_avx(auVar43,local_1350);
          local_1100 = vsubps_avx(auVar53,local_1360);
          local_10f0 = vsubps_avx(auVar54,auVar31);
          auVar23._0_4_ = local_1350._0_4_ + auVar43._0_4_;
          auVar23._4_4_ = local_1350._4_4_ + auVar43._4_4_;
          auVar23._8_4_ = local_1350._8_4_ + auVar43._8_4_;
          auVar23._12_4_ = local_1350._12_4_ + auVar43._12_4_;
          auVar57._0_4_ = local_1360._0_4_ + auVar53._0_4_;
          auVar57._4_4_ = local_1360._4_4_ + auVar53._4_4_;
          auVar57._8_4_ = local_1360._8_4_ + auVar53._8_4_;
          auVar57._12_4_ = local_1360._12_4_ + auVar53._12_4_;
          fVar100 = auVar31._0_4_;
          auVar60._0_4_ = fVar100 + auVar54._0_4_;
          fVar102 = auVar31._4_4_;
          auVar60._4_4_ = fVar102 + auVar54._4_4_;
          fVar104 = auVar31._8_4_;
          auVar60._8_4_ = fVar104 + auVar54._8_4_;
          fVar106 = auVar31._12_4_;
          auVar60._12_4_ = fVar106 + auVar54._12_4_;
          auVar96._0_4_ = local_10f0._0_4_ * auVar57._0_4_;
          auVar96._4_4_ = local_10f0._4_4_ * auVar57._4_4_;
          auVar96._8_4_ = local_10f0._8_4_ * auVar57._8_4_;
          auVar96._12_4_ = local_10f0._12_4_ * auVar57._12_4_;
          auVar65 = vfmsub231ps_fma(auVar96,local_1100,auVar60);
          auVar61._0_4_ = auVar60._0_4_ * auVar44._0_4_;
          auVar61._4_4_ = auVar60._4_4_ * auVar44._4_4_;
          auVar61._8_4_ = auVar60._8_4_ * auVar44._8_4_;
          auVar61._12_4_ = auVar60._12_4_ * auVar44._12_4_;
          auVar55 = vfmsub231ps_fma(auVar61,local_10f0,auVar23);
          auVar24._0_4_ = local_1100._0_4_ * auVar23._0_4_;
          auVar24._4_4_ = local_1100._4_4_ * auVar23._4_4_;
          auVar24._8_4_ = local_1100._8_4_ * auVar23._8_4_;
          auVar24._12_4_ = local_1100._12_4_ * auVar23._12_4_;
          auVar22 = vfmsub231ps_fma(auVar24,auVar44,auVar57);
          local_13a0._4_4_ = *(float *)(ray + k * 4 + 0xc0);
          auVar58._0_4_ = local_13a0._4_4_ * auVar22._0_4_;
          auVar58._4_4_ = local_13a0._4_4_ * auVar22._4_4_;
          auVar58._8_4_ = local_13a0._4_4_ * auVar22._8_4_;
          auVar58._12_4_ = local_13a0._4_4_ * auVar22._12_4_;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0xa0);
          auVar82._4_4_ = uVar9;
          auVar82._0_4_ = uVar9;
          auVar82._8_4_ = uVar9;
          auVar82._12_4_ = uVar9;
          auVar55 = vfmadd231ps_fma(auVar58,auVar82,auVar55);
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_1390._4_4_ = uVar9;
          local_1390._0_4_ = uVar9;
          local_1390._8_4_ = uVar9;
          local_1390._12_4_ = uVar9;
          local_1140 = vfmadd231ps_fma(auVar55,local_1390,auVar65);
          local_1110 = vsubps_avx(local_1360,auVar41);
          local_1120 = vsubps_avx(auVar31,auVar42);
          auVar66._0_4_ = auVar41._0_4_ + local_1360._0_4_;
          auVar66._4_4_ = auVar41._4_4_ + local_1360._4_4_;
          auVar66._8_4_ = auVar41._8_4_ + local_1360._8_4_;
          auVar66._12_4_ = auVar41._12_4_ + local_1360._12_4_;
          auVar62._0_4_ = fVar100 + auVar42._0_4_;
          auVar62._4_4_ = fVar102 + auVar42._4_4_;
          auVar62._8_4_ = fVar104 + auVar42._8_4_;
          auVar62._12_4_ = fVar106 + auVar42._12_4_;
          fVar99 = local_1120._0_4_;
          auVar69._0_4_ = auVar66._0_4_ * fVar99;
          fVar90 = local_1120._4_4_;
          auVar69._4_4_ = auVar66._4_4_ * fVar90;
          fVar84 = local_1120._8_4_;
          auVar69._8_4_ = auVar66._8_4_ * fVar84;
          fVar91 = local_1120._12_4_;
          auVar69._12_4_ = auVar66._12_4_ * fVar91;
          auVar55 = vfmsub231ps_fma(auVar69,local_1110,auVar62);
          local_1130 = vsubps_avx(local_1350,auVar30);
          fVar107 = local_1130._0_4_;
          auVar76._0_4_ = auVar62._0_4_ * fVar107;
          fVar94 = local_1130._4_4_;
          auVar76._4_4_ = auVar62._4_4_ * fVar94;
          fVar88 = local_1130._8_4_;
          auVar76._8_4_ = auVar62._8_4_ * fVar88;
          fVar92 = local_1130._12_4_;
          auVar76._12_4_ = auVar62._12_4_ * fVar92;
          auVar63._0_4_ = local_1350._0_4_ + auVar30._0_4_;
          auVar63._4_4_ = local_1350._4_4_ + auVar30._4_4_;
          auVar63._8_4_ = local_1350._8_4_ + auVar30._8_4_;
          auVar63._12_4_ = local_1350._12_4_ + auVar30._12_4_;
          auVar31 = vfmsub231ps_fma(auVar76,local_1120,auVar63);
          fVar111 = local_1110._0_4_;
          auVar64._0_4_ = auVar63._0_4_ * fVar111;
          fVar95 = local_1110._4_4_;
          auVar64._4_4_ = auVar63._4_4_ * fVar95;
          fVar89 = local_1110._8_4_;
          auVar64._8_4_ = auVar63._8_4_ * fVar89;
          fVar93 = local_1110._12_4_;
          auVar64._12_4_ = auVar63._12_4_ * fVar93;
          auVar65 = vfmsub231ps_fma(auVar64,local_1130,auVar66);
          auVar25._0_4_ = local_13a0._4_4_ * auVar65._0_4_;
          auVar25._4_4_ = local_13a0._4_4_ * auVar65._4_4_;
          auVar25._8_4_ = local_13a0._4_4_ * auVar65._8_4_;
          auVar25._12_4_ = local_13a0._4_4_ * auVar65._12_4_;
          auVar31 = vfmadd231ps_fma(auVar25,auVar82,auVar31);
          local_12a0 = vfmadd231ps_fma(auVar31,local_1390,auVar55);
          auVar55 = vsubps_avx(auVar30,auVar43);
          auVar70._0_4_ = auVar30._0_4_ + auVar43._0_4_;
          auVar70._4_4_ = auVar30._4_4_ + auVar43._4_4_;
          auVar70._8_4_ = auVar30._8_4_ + auVar43._8_4_;
          auVar70._12_4_ = auVar30._12_4_ + auVar43._12_4_;
          auVar43 = vsubps_avx(auVar41,auVar53);
          auVar46._0_4_ = auVar41._0_4_ + auVar53._0_4_;
          auVar46._4_4_ = auVar41._4_4_ + auVar53._4_4_;
          auVar46._8_4_ = auVar41._8_4_ + auVar53._8_4_;
          auVar46._12_4_ = auVar41._12_4_ + auVar53._12_4_;
          auVar41 = vsubps_avx(auVar42,auVar54);
          auVar32._0_4_ = auVar42._0_4_ + auVar54._0_4_;
          auVar32._4_4_ = auVar42._4_4_ + auVar54._4_4_;
          auVar32._8_4_ = auVar42._8_4_ + auVar54._8_4_;
          auVar32._12_4_ = auVar42._12_4_ + auVar54._12_4_;
          auVar67._0_4_ = auVar41._0_4_ * auVar46._0_4_;
          auVar67._4_4_ = auVar41._4_4_ * auVar46._4_4_;
          auVar67._8_4_ = auVar41._8_4_ * auVar46._8_4_;
          auVar67._12_4_ = auVar41._12_4_ * auVar46._12_4_;
          auVar30 = vfmsub231ps_fma(auVar67,auVar43,auVar32);
          auVar33._0_4_ = auVar32._0_4_ * auVar55._0_4_;
          auVar33._4_4_ = auVar32._4_4_ * auVar55._4_4_;
          auVar33._8_4_ = auVar32._8_4_ * auVar55._8_4_;
          auVar33._12_4_ = auVar32._12_4_ * auVar55._12_4_;
          auVar31 = vfmsub231ps_fma(auVar33,auVar41,auVar70);
          auVar71._0_4_ = auVar43._0_4_ * auVar70._0_4_;
          auVar71._4_4_ = auVar43._4_4_ * auVar70._4_4_;
          auVar71._8_4_ = auVar43._8_4_ * auVar70._8_4_;
          auVar71._12_4_ = auVar43._12_4_ * auVar70._12_4_;
          auVar42 = vfmsub231ps_fma(auVar71,auVar55,auVar46);
          local_13a0._0_4_ = local_13a0._4_4_;
          fStack_1398 = local_13a0._4_4_;
          fStack_1394 = local_13a0._4_4_;
          auVar47._0_4_ = local_13a0._4_4_ * auVar42._0_4_;
          auVar47._4_4_ = local_13a0._4_4_ * auVar42._4_4_;
          auVar47._8_4_ = local_13a0._4_4_ * auVar42._8_4_;
          auVar47._12_4_ = local_13a0._4_4_ * auVar42._12_4_;
          auVar31 = vfmadd231ps_fma(auVar47,auVar82,auVar31);
          auVar42 = vfmadd231ps_fma(auVar31,local_1390,auVar30);
          local_12b0 = local_1140._0_4_;
          fStack_12ac = local_1140._4_4_;
          fStack_12a8 = local_1140._8_4_;
          fStack_12a4 = local_1140._12_4_;
          local_1290._0_4_ = auVar42._0_4_ + local_12a0._0_4_ + local_12b0;
          local_1290._4_4_ = auVar42._4_4_ + local_12a0._4_4_ + fStack_12ac;
          local_1290._8_4_ = auVar42._8_4_ + local_12a0._8_4_ + fStack_12a8;
          local_1290._12_4_ = auVar42._12_4_ + local_12a0._12_4_ + fStack_12a4;
          auVar68._8_4_ = 0x7fffffff;
          auVar68._0_8_ = 0x7fffffff7fffffff;
          auVar68._12_4_ = 0x7fffffff;
          auVar31 = vminps_avx(local_1140,local_12a0);
          auVar31 = vminps_avx(auVar31,auVar42);
          local_1150 = vandps_avx(local_1290,auVar68);
          auVar77._0_4_ = local_1150._0_4_ * 1.1920929e-07;
          auVar77._4_4_ = local_1150._4_4_ * 1.1920929e-07;
          auVar77._8_4_ = local_1150._8_4_ * 1.1920929e-07;
          auVar77._12_4_ = local_1150._12_4_ * 1.1920929e-07;
          uVar18 = CONCAT44(auVar77._4_4_,auVar77._0_4_);
          auVar72._0_8_ = uVar18 ^ 0x8000000080000000;
          auVar72._8_4_ = -auVar77._8_4_;
          auVar72._12_4_ = -auVar77._12_4_;
          auVar31 = vcmpps_avx(auVar31,auVar72,5);
          auVar30 = vmaxps_avx(local_1140,local_12a0);
          auVar30 = vmaxps_avx(auVar30,auVar42);
          auVar30 = vcmpps_avx(auVar30,auVar77,2);
          auVar31 = vorps_avx(auVar31,auVar30);
          if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar31[0xf] < '\0') {
            auVar48._0_4_ = fVar111 * local_10f0._0_4_;
            auVar48._4_4_ = fVar95 * local_10f0._4_4_;
            auVar48._8_4_ = fVar89 * local_10f0._8_4_;
            auVar48._12_4_ = fVar93 * local_10f0._12_4_;
            auVar73._0_4_ = fVar107 * local_1100._0_4_;
            auVar73._4_4_ = fVar94 * local_1100._4_4_;
            auVar73._8_4_ = fVar88 * local_1100._8_4_;
            auVar73._12_4_ = fVar92 * local_1100._12_4_;
            auVar42 = vfmsub213ps_fma(local_1100,local_1120,auVar48);
            auVar78._0_4_ = auVar43._0_4_ * fVar99;
            auVar78._4_4_ = auVar43._4_4_ * fVar90;
            auVar78._8_4_ = auVar43._8_4_ * fVar84;
            auVar78._12_4_ = auVar43._12_4_ * fVar91;
            auVar34._0_4_ = fVar107 * auVar41._0_4_;
            auVar34._4_4_ = fVar94 * auVar41._4_4_;
            auVar34._8_4_ = fVar88 * auVar41._8_4_;
            auVar34._12_4_ = fVar92 * auVar41._12_4_;
            auVar53 = vfmsub213ps_fma(auVar41,local_1110,auVar78);
            auVar30 = vandps_avx(auVar48,auVar68);
            auVar41 = vandps_avx(auVar78,auVar68);
            auVar30 = vcmpps_avx(auVar30,auVar41,1);
            local_1230 = vblendvps_avx(auVar53,auVar42,auVar30);
            auVar79._0_4_ = fVar111 * auVar55._0_4_;
            auVar79._4_4_ = fVar95 * auVar55._4_4_;
            auVar79._8_4_ = fVar89 * auVar55._8_4_;
            auVar79._12_4_ = fVar93 * auVar55._12_4_;
            auVar42 = vfmsub213ps_fma(auVar55,local_1120,auVar34);
            auVar85._0_4_ = auVar44._0_4_ * fVar99;
            auVar85._4_4_ = auVar44._4_4_ * fVar90;
            auVar85._8_4_ = auVar44._8_4_ * fVar84;
            auVar85._12_4_ = auVar44._12_4_ * fVar91;
            auVar53 = vfmsub213ps_fma(local_10f0,local_1130,auVar85);
            auVar30 = vandps_avx(auVar85,auVar68);
            auVar41 = vandps_avx(auVar34,auVar68);
            auVar30 = vcmpps_avx(auVar30,auVar41,1);
            local_1220 = vblendvps_avx(auVar42,auVar53,auVar30);
            auVar42 = vfmsub213ps_fma(auVar44,local_1110,auVar73);
            auVar43 = vfmsub213ps_fma(auVar43,local_1130,auVar79);
            auVar30 = vandps_avx(auVar73,auVar68);
            auVar41 = vandps_avx(auVar79,auVar68);
            auVar30 = vcmpps_avx(auVar30,auVar41,1);
            local_1210 = vblendvps_avx(auVar43,auVar42,auVar30);
            auVar35._0_4_ = local_1210._0_4_ * local_13a0._4_4_;
            auVar35._4_4_ = local_1210._4_4_ * local_13a0._4_4_;
            auVar35._8_4_ = local_1210._8_4_ * local_13a0._4_4_;
            auVar35._12_4_ = local_1210._12_4_ * local_13a0._4_4_;
            auVar30 = vfmadd213ps_fma(auVar82,local_1220,auVar35);
            auVar30 = vfmadd213ps_fma(local_1390,local_1230,auVar30);
            auVar74._0_4_ = auVar30._0_4_ + auVar30._0_4_;
            auVar74._4_4_ = auVar30._4_4_ + auVar30._4_4_;
            auVar74._8_4_ = auVar30._8_4_ + auVar30._8_4_;
            auVar74._12_4_ = auVar30._12_4_ + auVar30._12_4_;
            auVar36._0_4_ = local_1210._0_4_ * fVar100;
            auVar36._4_4_ = local_1210._4_4_ * fVar102;
            auVar36._8_4_ = local_1210._8_4_ * fVar104;
            auVar36._12_4_ = local_1210._12_4_ * fVar106;
            auVar30 = vfmadd213ps_fma(local_1360,local_1220,auVar36);
            auVar41 = vfmadd213ps_fma(local_1350,local_1230,auVar30);
            auVar30 = vrcpps_avx(auVar74);
            auVar86._8_4_ = 0x3f800000;
            auVar86._0_8_ = 0x3f8000003f800000;
            auVar86._12_4_ = 0x3f800000;
            auVar42 = vfnmadd213ps_fma(auVar30,auVar74,auVar86);
            auVar30 = vfmadd132ps_fma(auVar42,auVar30,auVar30);
            local_1240._0_4_ = auVar30._0_4_ * (auVar41._0_4_ + auVar41._0_4_);
            local_1240._4_4_ = auVar30._4_4_ * (auVar41._4_4_ + auVar41._4_4_);
            local_1240._8_4_ = auVar30._8_4_ * (auVar41._8_4_ + auVar41._8_4_);
            local_1240._12_4_ = auVar30._12_4_ * (auVar41._12_4_ + auVar41._12_4_);
            auVar75 = ZEXT1664(local_1240);
            uVar9 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar37._4_4_ = uVar9;
            auVar37._0_4_ = uVar9;
            auVar37._8_4_ = uVar9;
            auVar37._12_4_ = uVar9;
            auVar30 = vcmpps_avx(auVar37,local_1240,2);
            uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar87._4_4_ = uVar9;
            auVar87._0_4_ = uVar9;
            auVar87._8_4_ = uVar9;
            auVar87._12_4_ = uVar9;
            auVar29 = ZEXT1664(auVar87);
            auVar41 = vcmpps_avx(local_1240,auVar87,2);
            auVar30 = vandps_avx(auVar30,auVar41);
            auVar41 = auVar31 & auVar30;
            if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar41[0xf] < '\0') {
              auVar30 = vandps_avx(auVar30,auVar31);
              auVar41 = vcmpps_avx(auVar74,_DAT_01f7aa10,4);
              auVar42 = auVar41 & auVar30;
              if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar42[0xf] < '\0') {
                local_1330 = vandps_avx(auVar30,auVar41);
                uStack_1338 = auVar31._8_8_;
                local_1340 = context->scene;
                auVar31 = vrcpps_avx(local_1290);
                auVar59._8_4_ = 0x3f800000;
                auVar59._0_8_ = 0x3f8000003f800000;
                auVar59._12_4_ = 0x3f800000;
                auVar30 = vfnmadd213ps_fma(local_1290,auVar31,auVar59);
                auVar30 = vfmadd132ps_fma(auVar30,auVar31,auVar31);
                auVar49._8_4_ = 0x219392ef;
                auVar49._0_8_ = 0x219392ef219392ef;
                auVar49._12_4_ = 0x219392ef;
                auVar31 = vcmpps_avx(local_1150,auVar49,5);
                auVar31 = vandps_avx(auVar30,auVar31);
                auVar26._0_4_ = local_12b0 * auVar31._0_4_;
                auVar26._4_4_ = fStack_12ac * auVar31._4_4_;
                auVar26._8_4_ = fStack_12a8 * auVar31._8_4_;
                auVar26._12_4_ = fStack_12a4 * auVar31._12_4_;
                local_1260 = vminps_avx(auVar26,auVar59);
                auVar27._0_4_ = local_12a0._0_4_ * auVar31._0_4_;
                auVar27._4_4_ = local_12a0._4_4_ * auVar31._4_4_;
                auVar27._8_4_ = local_12a0._8_4_ * auVar31._8_4_;
                auVar27._12_4_ = local_12a0._12_4_ * auVar31._12_4_;
                local_1250 = vminps_avx(auVar27,auVar59);
                auVar50._8_4_ = 0x7f800000;
                auVar50._0_8_ = 0x7f8000007f800000;
                auVar50._12_4_ = 0x7f800000;
                auVar31 = vblendvps_avx(auVar50,local_1240,local_1330);
                auVar30 = vshufps_avx(auVar31,auVar31,0xb1);
                auVar30 = vminps_avx(auVar30,auVar31);
                auVar41 = vshufpd_avx(auVar30,auVar30,1);
                auVar30 = vminps_avx(auVar41,auVar30);
                auVar31 = vcmpps_avx(auVar31,auVar30,0);
                auVar41 = local_1330 & auVar31;
                auVar30 = vpcmpeqd_avx(auVar30,auVar30);
                if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar41[0xf] < '\0') {
                  auVar30 = auVar31;
                }
                lVar13 = lVar13 + uVar14;
                auVar31 = vandps_avx(local_1330,auVar30);
                uVar9 = vmovmskps_avx(auVar31);
                lVar16 = 0;
                for (uVar18 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar9);
                    (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                  lVar16 = lVar16 + 1;
                }
                local_13a0 = lVar13;
                local_1270 = local_1330;
                do {
                  uVar11 = *(uint *)(lVar13 + 0x90 + lVar16 * 4);
                  uVar18 = (ulong)uVar11;
                  lVar13 = *(long *)(*(long *)((long)local_1340 + 0x1e8) + uVar18 * 8);
                  local_1390._0_8_ = lVar13;
                  if ((*(uint *)(lVar13 + 0x34) & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    *(undefined4 *)(local_1330 + lVar16 * 4) = 0;
                    lVar13 = local_13a0;
                  }
                  else {
                    local_1350._0_8_ = lVar16;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (*(long *)(lVar13 + 0x40) == 0)) {
                      uVar9 = *(undefined4 *)(local_1260 + lVar16 * 4);
                      uVar1 = *(undefined4 *)(local_1250 + lVar16 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_1240 + lVar16 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x180) =
                           *(undefined4 *)(local_1230 + lVar16 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) =
                           *(undefined4 *)(local_1220 + lVar16 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x1c0) =
                           *(undefined4 *)(local_1210 + lVar16 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar9;
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
                      *(undefined4 *)(ray + k * 4 + 0x220) =
                           *(undefined4 *)(local_13a0 + 0xa0 + lVar16 * 4);
                      *(uint *)(ray + k * 4 + 0x240) = uVar11;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    uVar9 = *(undefined4 *)(local_1260 + lVar16 * 4);
                    local_1060._4_4_ = uVar9;
                    local_1060._0_4_ = uVar9;
                    local_1060._8_4_ = uVar9;
                    local_1060._12_4_ = uVar9;
                    local_1060._16_4_ = uVar9;
                    local_1060._20_4_ = uVar9;
                    local_1060._24_4_ = uVar9;
                    local_1060._28_4_ = uVar9;
                    local_1040 = *(undefined4 *)(local_1250 + lVar16 * 4);
                    uVar9 = *(undefined4 *)(local_13a0 + 0xa0 + lVar16 * 4);
                    local_1020._4_4_ = uVar9;
                    local_1020._0_4_ = uVar9;
                    local_1020._8_4_ = uVar9;
                    local_1020._12_4_ = uVar9;
                    local_1020._16_4_ = uVar9;
                    local_1020._20_4_ = uVar9;
                    local_1020._24_4_ = uVar9;
                    local_1020._28_4_ = uVar9;
                    uVar9 = *(undefined4 *)(local_1230 + lVar16 * 4);
                    local_10c0._4_4_ = uVar9;
                    local_10c0._0_4_ = uVar9;
                    local_10c0._8_4_ = uVar9;
                    local_10c0._12_4_ = uVar9;
                    register0x00001310 = uVar9;
                    register0x00001314 = uVar9;
                    register0x00001318 = uVar9;
                    register0x0000131c = uVar9;
                    uVar9 = *(undefined4 *)(local_1220 + lVar16 * 4);
                    local_10a0._4_4_ = uVar9;
                    local_10a0._0_4_ = uVar9;
                    local_10a0._8_4_ = uVar9;
                    local_10a0._12_4_ = uVar9;
                    local_10a0._16_4_ = uVar9;
                    local_10a0._20_4_ = uVar9;
                    local_10a0._24_4_ = uVar9;
                    local_10a0._28_4_ = uVar9;
                    uVar9 = *(undefined4 *)(local_1210 + lVar16 * 4);
                    local_1080._4_4_ = uVar9;
                    local_1080._0_4_ = uVar9;
                    local_1080._8_4_ = uVar9;
                    local_1080._12_4_ = uVar9;
                    local_1080._16_4_ = uVar9;
                    local_1080._20_4_ = uVar9;
                    local_1080._24_4_ = uVar9;
                    local_1080._28_4_ = uVar9;
                    auVar51._4_4_ = uVar11;
                    auVar51._0_4_ = uVar11;
                    auVar51._8_4_ = uVar11;
                    auVar51._12_4_ = uVar11;
                    auVar52._16_4_ = uVar11;
                    auVar52._0_16_ = auVar51;
                    auVar52._20_4_ = uVar11;
                    auVar52._24_4_ = uVar11;
                    auVar52._28_4_ = uVar11;
                    uStack_103c = local_1040;
                    uStack_1038 = local_1040;
                    uStack_1034 = local_1040;
                    uStack_1030 = local_1040;
                    uStack_102c = local_1040;
                    uStack_1028 = local_1040;
                    uStack_1024 = local_1040;
                    local_1000 = auVar52;
                    vpcmpeqd_avx2(local_1060,local_1060);
                    uStack_fdc = context->user->instID[0];
                    local_fe0 = uStack_fdc;
                    uStack_fd8 = uStack_fdc;
                    uStack_fd4 = uStack_fdc;
                    uStack_fd0 = uStack_fdc;
                    uStack_fcc = uStack_fdc;
                    uStack_fc8 = uStack_fdc;
                    uStack_fc4 = uStack_fdc;
                    uStack_fbc = context->user->instPrimID[0];
                    local_fc0 = uStack_fbc;
                    uStack_fb8 = uStack_fbc;
                    uStack_fb4 = uStack_fbc;
                    uStack_fb0 = uStack_fbc;
                    uStack_fac = uStack_fbc;
                    uStack_fa8 = uStack_fbc;
                    uStack_fa4 = uStack_fbc;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1240 + lVar16 * 4);
                    local_1200 = local_10e0;
                    local_12f0.valid = (int *)local_1200;
                    local_12f0.geometryUserPtr = *(void **)(lVar13 + 0x18);
                    local_12f0.context = context->user;
                    local_12f0.hit = local_10c0;
                    local_12f0.N = 8;
                    local_12f0.ray = (RTCRayN *)ray;
                    if (*(code **)(lVar13 + 0x40) != (code *)0x0) {
                      local_1360._0_8_ = lVar19;
                      local_1370 = auVar75._0_16_;
                      local_1380 = auVar29._0_16_;
                      auVar52 = ZEXT1632(auVar51);
                      (**(code **)(lVar13 + 0x40))(&local_12f0);
                      auVar29 = ZEXT1664(local_1380);
                      auVar75 = ZEXT1664(local_1370);
                      k = local_1318;
                      uVar17 = local_13a8;
                      ray = local_1310;
                      lVar19 = local_1360._0_8_;
                    }
                    auVar5 = vpcmpeqd_avx2(local_1200,_DAT_01faff00);
                    auVar52 = vpcmpeqd_avx2(auVar52,auVar52);
                    auVar39 = auVar52 & ~auVar5;
                    if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar39 >> 0x7f,0) == '\0') &&
                          (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar39 >> 0xbf,0) == '\0') &&
                        (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar39[0x1f]) {
                      auVar5 = auVar5 ^ auVar52;
                    }
                    else {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_1390._0_8_ + 0x3e) & 0x40) != 0)))) {
                        local_1360._0_8_ = lVar19;
                        local_1370 = auVar75._0_16_;
                        local_1380 = auVar29._0_16_;
                        auVar52 = ZEXT1632(auVar52._0_16_);
                        (*p_Var4)(&local_12f0);
                        auVar29 = ZEXT1664(local_1380);
                        auVar75 = ZEXT1664(local_1370);
                        k = local_1318;
                        uVar17 = local_13a8;
                        ray = local_1310;
                        lVar19 = local_1360._0_8_;
                      }
                      auVar6 = vpcmpeqd_avx2(local_1200,_DAT_01faff00);
                      auVar52 = vpcmpeqd_avx2(auVar52,auVar52);
                      auVar5 = auVar6 ^ auVar52;
                      auVar39 = auVar52 & ~auVar6;
                      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar39 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar39 >> 0x7f,0) != '\0') ||
                            (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar39 >> 0xbf,0) != '\0') ||
                          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar39[0x1f] < '\0') {
                        auVar40._0_4_ = auVar6._0_4_ ^ auVar52._0_4_;
                        auVar40._4_4_ = auVar6._4_4_ ^ auVar52._4_4_;
                        auVar40._8_4_ = auVar6._8_4_ ^ auVar52._8_4_;
                        auVar40._12_4_ = auVar6._12_4_ ^ auVar52._12_4_;
                        auVar40._16_4_ = auVar6._16_4_ ^ auVar52._16_4_;
                        auVar40._20_4_ = auVar6._20_4_ ^ auVar52._20_4_;
                        auVar40._24_4_ = auVar6._24_4_ ^ auVar52._24_4_;
                        auVar40._28_4_ = auVar6._28_4_ ^ auVar52._28_4_;
                        auVar39 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])local_12f0.hit);
                        *(undefined1 (*) [32])(local_12f0.ray + 0x180) = auVar39;
                        auVar39 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])
                                                          (local_12f0.hit + 0x20));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x1a0) = auVar39;
                        auVar39 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])
                                                          (local_12f0.hit + 0x40));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x1c0) = auVar39;
                        auVar39 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])
                                                          (local_12f0.hit + 0x60));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x1e0) = auVar39;
                        auVar39 = vmaskmovps_avx(auVar40,*(undefined1 (*) [32])
                                                          (local_12f0.hit + 0x80));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x200) = auVar39;
                        auVar39 = vpmaskmovd_avx2(auVar40,*(undefined1 (*) [32])
                                                           (local_12f0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x220) = auVar39;
                        auVar39 = vpmaskmovd_avx2(auVar40,*(undefined1 (*) [32])
                                                           (local_12f0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x240) = auVar39;
                        auVar39 = vpmaskmovd_avx2(auVar40,*(undefined1 (*) [32])
                                                           (local_12f0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x260) = auVar39;
                        auVar39 = vpmaskmovd_avx2(auVar40,*(undefined1 (*) [32])
                                                           (local_12f0.hit + 0x100));
                        *(undefined1 (*) [32])(local_12f0.ray + 0x280) = auVar39;
                      }
                    }
                    if ((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar5 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar5 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar5 >> 0x7f,0) == '\0') &&
                          (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar5 >> 0xbf,0) == '\0') &&
                        (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar5[0x1f]) {
                      *(int *)(ray + k * 4 + 0x100) = auVar29._0_4_;
                    }
                    else {
                      auVar29 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    }
                    *(undefined4 *)(local_1330 + local_1350._0_8_ * 4) = 0;
                    uVar9 = auVar29._0_4_;
                    auVar28._4_4_ = uVar9;
                    auVar28._0_4_ = uVar9;
                    auVar28._8_4_ = uVar9;
                    auVar28._12_4_ = uVar9;
                    auVar31 = vcmpps_avx(auVar75._0_16_,auVar28,2);
                    local_1330 = vandps_avx(auVar31,local_1330);
                    uVar18 = local_1350._0_8_;
                    lVar13 = local_13a0;
                  }
                  if ((((local_1330 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_1330 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_1330 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_1330[0xf]) break;
                  auVar38._8_4_ = 0x7f800000;
                  auVar38._0_8_ = 0x7f8000007f800000;
                  auVar38._12_4_ = 0x7f800000;
                  auVar31 = vblendvps_avx(auVar38,auVar75._0_16_,local_1330);
                  auVar30 = vshufps_avx(auVar31,auVar31,0xb1);
                  auVar30 = vminps_avx(auVar30,auVar31);
                  auVar41 = vshufpd_avx(auVar30,auVar30,1);
                  auVar30 = vminps_avx(auVar41,auVar30);
                  auVar30 = vcmpps_avx(auVar31,auVar30,0);
                  auVar41 = local_1330 & auVar30;
                  auVar31 = local_1330;
                  if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar41[0xf] < '\0') {
                    auVar31 = vandps_avx(auVar30,local_1330);
                  }
                  uVar9 = vmovmskps_avx(auVar31);
                  lVar16 = 0;
                  for (uVar18 = CONCAT44((int)(uVar18 >> 0x20),uVar9); (uVar18 & 1) == 0;
                      uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                    lVar16 = lVar16 + 1;
                  }
                } while( true );
              }
            }
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != local_1308);
      }
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar29 = ZEXT1664(CONCAT412(uVar9,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))));
      auVar80 = ZEXT1664(local_1160);
      auVar81 = ZEXT1664(local_1170);
      auVar83 = ZEXT1664(local_1180);
      auVar75 = ZEXT1664(local_12c0);
      fVar84 = local_1190;
      fVar88 = fStack_118c;
      fVar89 = fStack_1188;
      fVar90 = fStack_1184;
      fVar91 = local_11a0;
      fVar92 = fStack_119c;
      fVar93 = fStack_1198;
      fVar94 = fStack_1194;
      fVar100 = local_11b0;
      fVar102 = fStack_11ac;
      fVar104 = fStack_11a8;
      fVar95 = fStack_11a4;
      fVar106 = local_11c0;
      fVar97 = fStack_11bc;
      fVar98 = fStack_11b8;
      fVar99 = fStack_11b4;
      fVar101 = local_11d0;
      fVar103 = fStack_11cc;
      fVar105 = fStack_11c8;
      fVar107 = fStack_11c4;
      fVar108 = local_11e0;
      fVar109 = fStack_11dc;
      fVar110 = fStack_11d8;
      fVar111 = fStack_11d4;
    }
    if (pauVar10 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }